

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::DriverVisitor&>
          (AssertionInstanceExpression *this,DriverVisitor *visitor)

{
  bool bVar1;
  DriverVisitor *in_RDI;
  DeclaredType *unaff_retaddr;
  Expression *init;
  DeclaredType *dt;
  Symbol *sym;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffc0;
  DriverVisitor *in_stack_ffffffffffffffc8;
  AssertionExpr *in_stack_ffffffffffffffd0;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_20;
  char *local_18;
  
  AssertionExpr::visit<slang::ast::DriverVisitor>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_18 = (in_RDI->visitedValues).super_Storage.buffer + 0x30;
  local_20._M_current =
       (Symbol **)
       std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)in_RDI);
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_20);
    in_stack_ffffffffffffffc8 =
         (DriverVisitor *)Symbol::getDeclaredType((Symbol *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc0 = DeclaredType::getInitializer(unaff_retaddr);
    if (in_stack_ffffffffffffffc0 != (Expression *)0x0) {
      Expression::visit<slang::ast::DriverVisitor&>(in_stack_ffffffffffffffc0,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }